

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_exception
          (JUnitReporter *this,TestCaseException *e)

{
  string *message;
  JUnitTestCaseData *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff58;
  lock_guard<std::mutex> *in_stack_ffffffffffffff60;
  allocator *details;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [56];
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"exception",&local_39);
  message = (string *)String::c_str((String *)0x1493d9);
  details = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,(char *)message,details);
  JUnitTestCaseData::addError(in_RDI,message,(string *)details);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x149450);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            std::lock_guard<std::mutex> lock(mutex);
            testCaseData.addError("exception", e.error_string.c_str());
        }